

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O3

int secp256k1_musig_nonce_agg
              (secp256k1_context *ctx,secp256k1_musig_aggnonce *aggnonce,
              secp256k1_musig_pubnonce **pubnonces,size_t n_pubnonces)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined4 uVar124;
  undefined4 uVar125;
  uint64_t uVar126;
  uint64_t uVar127;
  long lVar128;
  bool bVar129;
  int iVar130;
  ulong uVar131;
  bool bVar132;
  size_t sVar133;
  ulong uVar134;
  uint64_t uVar135;
  secp256k1_gej *psVar136;
  secp256k1_ge *psVar137;
  long lVar138;
  uchar *buf;
  ulong uVar139;
  ulong uVar140;
  ulong uVar141;
  long lVar142;
  secp256k1_ge aggnonce_pts [2];
  secp256k1_ge nonce_pts [2];
  secp256k1_gej aggnonce_ptsj [2];
  secp256k1_ge local_298 [2];
  secp256k1_ge local_1e8;
  secp256k1_ge local_190;
  secp256k1_gej local_138;
  secp256k1_gej local_b8;
  
  if (aggnonce == (secp256k1_musig_aggnonce *)0x0) {
    secp256k1_musig_nonce_agg_cold_3();
  }
  else if (pubnonces == (secp256k1_musig_pubnonce **)0x0) {
    secp256k1_musig_nonce_agg_cold_2();
  }
  else if (n_pubnonces == 0) {
    secp256k1_musig_nonce_agg_cold_1();
  }
  else {
    local_138.infinity = 1;
    local_138.x.n[0] = 0;
    local_138.x.n[1] = 0;
    local_138.x.n[2] = 0;
    local_138.x.n[3] = 0;
    local_138.x.n[4] = 0;
    local_138.y.n[0] = 0;
    local_138.y.n[1] = 0;
    local_138.y.n[2] = 0;
    local_138.y.n[3] = 0;
    local_138.y.n[4] = 0;
    local_138.z.n[0] = 0;
    local_138.z.n[1] = 0;
    local_138.z.n[2] = 0;
    local_138.z.n[3] = 0;
    sVar133 = 0;
    local_138.z.n[4] = 0;
    local_b8.infinity = 1;
    local_b8.z.n[4] = 0;
    local_b8.z.n[2] = 0;
    local_b8.z.n[3] = 0;
    local_b8.z.n[0] = 0;
    local_b8.z.n[1] = 0;
    local_b8.y.n[3] = 0;
    local_b8.y.n[4] = 0;
    local_b8.y.n[1] = 0;
    local_b8.y.n[2] = 0;
    local_b8.x.n[4] = 0;
    local_b8.y.n[0] = 0;
    local_b8.x.n[2] = 0;
    local_b8.x.n[3] = 0;
    local_b8.x.n[0] = 0;
    local_b8.x.n[1] = 0;
    while (iVar130 = secp256k1_musig_pubnonce_load(ctx,&local_1e8,pubnonces[sVar133]), iVar130 != 0)
    {
      secp256k1_gej_add_ge_var(&local_138,&local_138,&local_1e8,(secp256k1_fe *)0x0);
      secp256k1_gej_add_ge_var(&local_b8,&local_b8,&local_190,(secp256k1_fe *)0x0);
      sVar133 = sVar133 + 1;
      if (n_pubnonces == sVar133) {
        psVar137 = local_298;
        psVar136 = &local_138;
        lVar138 = -1;
        lVar128 = 0;
        bVar129 = true;
        do {
          bVar132 = bVar129;
          lVar142 = lVar128;
          if (psVar136->infinity == 0) {
            if (lVar138 == -1) {
              (psVar137->x).n[4] = (psVar136->z).n[4];
              uVar126 = (psVar136->z).n[0];
              uVar124 = *(undefined4 *)((long)(psVar136->z).n + 4);
              uVar127 = (psVar136->z).n[1];
              uVar125 = *(undefined4 *)((long)(psVar136->z).n + 0xc);
              uVar135 = (psVar136->z).n[3];
              (psVar137->x).n[2] = (psVar136->z).n[2];
              (psVar137->x).n[3] = uVar135;
              *(int *)(psVar137->x).n = (int)uVar126;
              *(undefined4 *)((long)(psVar137->x).n + 4) = uVar124;
              *(int *)((psVar137->x).n + 1) = (int)uVar127;
              *(undefined4 *)((long)(psVar137->x).n + 0xc) = uVar125;
            }
            else {
              secp256k1_fe_impl_mul(&psVar137->x,&local_298[lVar138].x,&psVar136->z);
            }
          }
          else {
            psVar137->infinity = 1;
            (psVar137->x).n[0] = 0;
            (psVar137->x).n[1] = 0;
            (psVar137->x).n[2] = 0;
            (psVar137->x).n[3] = 0;
            (psVar137->x).n[4] = 0;
            (psVar137->y).n[0] = 0;
            (psVar137->y).n[1] = 0;
            (psVar137->y).n[2] = 0;
            (psVar137->y).n[3] = 0;
            (psVar137->y).n[4] = 0;
            lVar142 = lVar138;
          }
          psVar137 = local_298 + 1;
          psVar136 = &local_b8;
          lVar138 = lVar142;
          lVar128 = 1;
          bVar129 = false;
        } while (bVar132);
        if (lVar142 != -1) {
          secp256k1_fe_impl_inv_var(&local_1e8.x,&local_298[lVar142].x);
          uVar135 = local_1e8.x.n[0];
          if (lVar142 == 0) {
            lVar142 = 0;
          }
          else if (local_138.infinity == 0) {
            auVar4._8_8_ = 0;
            auVar4._0_8_ = local_298[0].x.n[0];
            auVar66._8_8_ = 0;
            auVar66._0_8_ = local_1e8.x.n[3];
            auVar5._8_8_ = 0;
            auVar5._0_8_ = local_298[0].x.n[1];
            auVar67._8_8_ = 0;
            auVar67._0_8_ = local_1e8.x.n[2];
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_298[0].x.n[2];
            auVar68._8_8_ = 0;
            auVar68._0_8_ = local_1e8.x.n[1];
            auVar7._8_8_ = 0;
            auVar7._0_8_ = local_298[0].x.n[3];
            auVar69._8_8_ = 0;
            auVar69._0_8_ = local_1e8.x.n[0];
            auVar8._8_8_ = 0;
            auVar8._0_8_ = local_298[0].x.n[4];
            auVar70._8_8_ = 0;
            auVar70._0_8_ = local_1e8.x.n[4];
            auVar9._8_8_ = 0;
            auVar9._0_8_ = SUB168(auVar8 * auVar70,0);
            auVar6 = auVar5 * auVar67 + auVar4 * auVar66 + auVar6 * auVar68 + auVar7 * auVar69 +
                     auVar9 * ZEXT816(0x1000003d10);
            auVar10._8_8_ = 0;
            auVar10._0_8_ = local_298[0].x.n[0];
            auVar71._8_8_ = 0;
            auVar71._0_8_ = local_1e8.x.n[4];
            auVar11._8_8_ = 0;
            auVar11._0_8_ = local_298[0].x.n[1];
            auVar72._8_8_ = 0;
            auVar72._0_8_ = local_1e8.x.n[3];
            auVar12._8_8_ = 0;
            auVar12._0_8_ = local_298[0].x.n[2];
            auVar73._8_8_ = 0;
            auVar73._0_8_ = local_1e8.x.n[2];
            auVar13._8_8_ = 0;
            auVar13._0_8_ = local_298[0].x.n[3];
            auVar74._8_8_ = 0;
            auVar74._0_8_ = local_1e8.x.n[1];
            auVar14._8_8_ = 0;
            auVar14._0_8_ = local_298[0].x.n[4];
            auVar75._8_8_ = 0;
            auVar75._0_8_ = local_1e8.x.n[0];
            auVar15._8_8_ = 0;
            auVar15._0_8_ = SUB168(auVar8 * auVar70,8);
            auVar4 = auVar15 * ZEXT816(0x1000003d10000) +
                     auVar14 * auVar75 +
                     auVar13 * auVar74 + auVar12 * auVar73 + auVar10 * auVar71 + auVar11 * auVar72 +
                     (auVar6 >> 0x34);
            auVar16._8_8_ = 0;
            auVar16._0_8_ = local_298[0].x.n[0];
            auVar76._8_8_ = 0;
            auVar76._0_8_ = local_1e8.x.n[0];
            auVar17._8_8_ = 0;
            auVar17._0_8_ = local_298[0].x.n[1];
            auVar77._8_8_ = 0;
            auVar77._0_8_ = local_1e8.x.n[4];
            auVar18._8_8_ = 0;
            auVar18._0_8_ = local_298[0].x.n[2];
            auVar78._8_8_ = 0;
            auVar78._0_8_ = local_1e8.x.n[3];
            auVar19._8_8_ = 0;
            auVar19._0_8_ = local_298[0].x.n[3];
            auVar79._8_8_ = 0;
            auVar79._0_8_ = local_1e8.x.n[2];
            auVar20._8_8_ = 0;
            auVar20._0_8_ = local_298[0].x.n[4];
            auVar80._8_8_ = 0;
            auVar80._0_8_ = local_1e8.x.n[1];
            auVar5 = auVar20 * auVar80 + auVar19 * auVar79 + auVar18 * auVar78 + auVar17 * auVar77 +
                     (auVar4 >> 0x34);
            auVar21._8_8_ = 0;
            auVar21._0_8_ = (auVar5._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar4._6_2_ & 0xf);
            auVar7 = auVar16 * auVar76 + auVar21 * ZEXT816(0x1000003d1);
            uVar131 = auVar7._0_8_;
            uVar134 = auVar7._8_8_;
            auVar22._8_8_ = 0;
            auVar22._0_8_ = local_298[0].x.n[0];
            auVar81._8_8_ = 0;
            auVar81._0_8_ = local_1e8.x.n[1];
            auVar23._8_8_ = 0;
            auVar23._0_8_ = local_298[0].x.n[1];
            auVar82._8_8_ = 0;
            auVar82._0_8_ = local_1e8.x.n[0];
            auVar116._8_8_ = uVar134 >> 0x34;
            auVar116._0_8_ = uVar134 * 0x1000 | uVar131 >> 0x34;
            auVar24._8_8_ = 0;
            auVar24._0_8_ = local_298[0].x.n[2];
            auVar83._8_8_ = 0;
            auVar83._0_8_ = local_1e8.x.n[4];
            auVar25._8_8_ = 0;
            auVar25._0_8_ = local_298[0].x.n[3];
            auVar84._8_8_ = 0;
            auVar84._0_8_ = local_1e8.x.n[3];
            auVar26._8_8_ = 0;
            auVar26._0_8_ = local_298[0].x.n[4];
            auVar85._8_8_ = 0;
            auVar85._0_8_ = local_1e8.x.n[2];
            auVar5 = (auVar5 >> 0x34) + auVar26 * auVar85 + auVar25 * auVar84 + auVar24 * auVar83;
            uVar140 = auVar5._0_8_;
            uVar134 = auVar5._8_8_;
            auVar27._8_8_ = 0;
            auVar27._0_8_ = uVar140 & 0xfffffffffffff;
            auVar116 = auVar27 * ZEXT816(0x1000003d10) + auVar22 * auVar81 + auVar23 * auVar82 +
                       auVar116;
            auVar117._8_8_ = uVar134 >> 0x34;
            auVar117._0_8_ = uVar134 * 0x1000 | uVar140 >> 0x34;
            auVar28._8_8_ = 0;
            auVar28._0_8_ = local_298[0].x.n[0];
            auVar86._8_8_ = 0;
            auVar86._0_8_ = local_1e8.x.n[2];
            auVar29._8_8_ = 0;
            auVar29._0_8_ = local_298[0].x.n[1];
            auVar87._8_8_ = 0;
            auVar87._0_8_ = local_1e8.x.n[1];
            auVar30._8_8_ = 0;
            auVar30._0_8_ = local_298[0].x.n[2];
            auVar88._8_8_ = 0;
            auVar88._0_8_ = local_1e8.x.n[0];
            auVar31._8_8_ = 0;
            auVar31._0_8_ = local_298[0].x.n[3];
            auVar89._8_8_ = 0;
            auVar89._0_8_ = local_1e8.x.n[4];
            auVar32._8_8_ = 0;
            auVar32._0_8_ = local_298[0].x.n[4];
            auVar90._8_8_ = 0;
            auVar90._0_8_ = local_1e8.x.n[3];
            auVar117 = auVar32 * auVar90 + auVar31 * auVar89 + auVar117;
            auVar33._8_8_ = 0;
            auVar33._0_8_ = auVar117._0_8_;
            auVar5 = auVar33 * ZEXT816(0x1000003d10) +
                     auVar30 * auVar88 + auVar29 * auVar87 + auVar28 * auVar86 + (auVar116 >> 0x34);
            auVar7 = auVar5 >> 0x34;
            auVar121._8_8_ = 0;
            auVar121._0_8_ = auVar7._0_8_;
            auVar34._8_8_ = 0;
            auVar34._0_8_ = auVar117._8_8_;
            auVar120._8_8_ = auVar7._8_8_;
            auVar120._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
            auVar121 = auVar34 * ZEXT816(0x1000003d10000) + auVar120 + auVar121;
            uVar139 = auVar121._0_8_;
            uVar134 = (&local_b8)[lVar142 + -1].z.n[3];
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar134;
            auVar91._8_8_ = 0;
            auVar91._0_8_ = local_1e8.x.n[0];
            uVar140 = (&local_b8)[lVar142 + -1].z.n[2];
            auVar36._8_8_ = 0;
            auVar36._0_8_ = uVar140;
            auVar92._8_8_ = 0;
            auVar92._0_8_ = local_1e8.x.n[1];
            uVar1 = (&local_b8)[lVar142 + -1].z.n[1];
            auVar37._8_8_ = 0;
            auVar37._0_8_ = uVar1;
            auVar93._8_8_ = 0;
            auVar93._0_8_ = local_1e8.x.n[2];
            uVar2 = (&local_138)[lVar142].z.n[0];
            auVar38._8_8_ = 0;
            auVar38._0_8_ = uVar2;
            auVar94._8_8_ = 0;
            auVar94._0_8_ = local_1e8.x.n[3];
            uVar3 = (&local_b8)[lVar142 + -1].z.n[4];
            auVar39._8_8_ = 0;
            auVar39._0_8_ = uVar3;
            auVar95._8_8_ = 0;
            auVar95._0_8_ = local_1e8.x.n[4];
            auVar40._8_8_ = 0;
            auVar40._0_8_ = SUB168(auVar39 * auVar95,0);
            auVar6 = auVar35 * auVar91 + auVar36 * auVar92 + auVar37 * auVar93 + auVar38 * auVar94 +
                     auVar40 * ZEXT816(0x1000003d10);
            auVar41._8_8_ = 0;
            auVar41._0_8_ = uVar3;
            auVar96._8_8_ = 0;
            auVar96._0_8_ = local_1e8.x.n[0];
            auVar42._8_8_ = 0;
            auVar42._0_8_ = uVar134;
            auVar97._8_8_ = 0;
            auVar97._0_8_ = local_1e8.x.n[1];
            auVar43._8_8_ = 0;
            auVar43._0_8_ = uVar140;
            auVar98._8_8_ = 0;
            auVar98._0_8_ = local_1e8.x.n[2];
            auVar44._8_8_ = 0;
            auVar44._0_8_ = uVar1;
            auVar99._8_8_ = 0;
            auVar99._0_8_ = local_1e8.x.n[3];
            auVar45._8_8_ = 0;
            auVar45._0_8_ = uVar2;
            auVar100._8_8_ = 0;
            auVar100._0_8_ = local_1e8.x.n[4];
            auVar46._8_8_ = 0;
            auVar46._0_8_ = SUB168(auVar39 * auVar95,8);
            auVar7 = auVar46 * ZEXT816(0x1000003d10000) +
                     auVar41 * auVar96 +
                     auVar45 * auVar100 + auVar44 * auVar99 + auVar43 * auVar98 + auVar42 * auVar97
                     + (auVar6 >> 0x34);
            auVar47._8_8_ = 0;
            auVar47._0_8_ = uVar2;
            auVar101._8_8_ = 0;
            auVar101._0_8_ = local_1e8.x.n[0];
            auVar48._8_8_ = 0;
            auVar48._0_8_ = uVar3;
            auVar102._8_8_ = 0;
            auVar102._0_8_ = local_1e8.x.n[1];
            auVar49._8_8_ = 0;
            auVar49._0_8_ = uVar134;
            auVar103._8_8_ = 0;
            auVar103._0_8_ = local_1e8.x.n[2];
            auVar50._8_8_ = 0;
            auVar50._0_8_ = uVar140;
            auVar104._8_8_ = 0;
            auVar104._0_8_ = local_1e8.x.n[3];
            auVar51._8_8_ = 0;
            auVar51._0_8_ = uVar1;
            auVar105._8_8_ = 0;
            auVar105._0_8_ = local_1e8.x.n[4];
            local_298[lVar142].x.n[0] = uVar131 & 0xfffffffffffff;
            local_298[lVar142].x.n[1] = auVar116._0_8_ & 0xfffffffffffff;
            auVar8 = (auVar7 >> 0x34) +
                     auVar51 * auVar105 + auVar50 * auVar104 + auVar49 * auVar103 +
                     auVar48 * auVar102;
            uVar131 = auVar8._0_8_;
            uVar141 = auVar8._8_8_;
            auVar118._8_8_ = uVar141 >> 0x34;
            auVar118._0_8_ = uVar141 * 0x1000 | uVar131 >> 0x34;
            auVar52._8_8_ = 0;
            auVar52._0_8_ = uVar131 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar7._6_2_ & 0xf);
            auVar8 = auVar47 * auVar101 + auVar52 * ZEXT816(0x1000003d1);
            uVar131 = auVar8._0_8_;
            uVar141 = auVar8._8_8_;
            auVar119._8_8_ = uVar141 >> 0x34;
            auVar119._0_8_ = uVar141 * 0x1000 | uVar131 >> 0x34;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = uVar1;
            auVar106._8_8_ = 0;
            auVar106._0_8_ = local_1e8.x.n[0];
            auVar54._8_8_ = 0;
            auVar54._0_8_ = uVar2;
            auVar107._8_8_ = 0;
            auVar107._0_8_ = local_1e8.x.n[1];
            auVar55._8_8_ = 0;
            auVar55._0_8_ = uVar3;
            auVar108._8_8_ = 0;
            auVar108._0_8_ = local_1e8.x.n[2];
            uVar135 = uVar131 & 0xfffffffffffff;
            auVar56._8_8_ = 0;
            auVar56._0_8_ = uVar134;
            auVar109._8_8_ = 0;
            auVar109._0_8_ = local_1e8.x.n[3];
            auVar57._8_8_ = 0;
            auVar57._0_8_ = uVar140;
            auVar110._8_8_ = 0;
            auVar110._0_8_ = local_1e8.x.n[4];
            local_298[lVar142].x.n[2] = auVar5._0_8_ & 0xfffffffffffff;
            auVar118 = auVar56 * auVar109 + auVar57 * auVar110 + auVar55 * auVar108 + auVar118;
            auVar58._8_8_ = 0;
            auVar58._0_8_ = auVar118._0_8_ & 0xfffffffffffff;
            auVar119 = auVar58 * ZEXT816(0x1000003d10) + auVar53 * auVar106 + auVar54 * auVar107 +
                       auVar119;
            auVar59._8_8_ = 0;
            auVar59._0_8_ = uVar140;
            auVar111._8_8_ = 0;
            auVar111._0_8_ = local_1e8.x.n[0];
            auVar60._8_8_ = 0;
            auVar60._0_8_ = uVar1;
            auVar112._8_8_ = 0;
            auVar112._0_8_ = local_1e8.x.n[1];
            auVar61._8_8_ = 0;
            auVar61._0_8_ = uVar2;
            auVar113._8_8_ = 0;
            auVar113._0_8_ = local_1e8.x.n[2];
            local_1e8.x.n[1] = auVar119._0_8_ & 0xfffffffffffff;
            auVar62._8_8_ = 0;
            auVar62._0_8_ = uVar3;
            auVar114._8_8_ = 0;
            auVar114._0_8_ = local_1e8.x.n[3];
            auVar63._8_8_ = 0;
            auVar63._0_8_ = uVar134;
            auVar115._8_8_ = 0;
            auVar115._0_8_ = local_1e8.x.n[4];
            local_298[lVar142].x.n[3] = uVar139 & 0xfffffffffffff;
            auVar5 = auVar63 * auVar115 + auVar62 * auVar114 + (auVar118 >> 0x34);
            local_298[lVar142].x.n[4] =
                 (auVar121._8_8_ << 0xc | uVar139 >> 0x34) + (auVar4._0_8_ & 0xffffffffffff);
            auVar64._8_8_ = 0;
            auVar64._0_8_ = auVar5._0_8_;
            auVar4 = auVar64 * ZEXT816(0x1000003d10) +
                     auVar61 * auVar113 + auVar59 * auVar111 + auVar60 * auVar112 +
                     (auVar119 >> 0x34);
            auVar8 = auVar4 >> 0x34;
            auVar123._8_8_ = 0;
            auVar123._0_8_ = auVar8._0_8_;
            local_1e8.x.n[2] = auVar4._0_8_ & 0xfffffffffffff;
            auVar65._8_8_ = 0;
            auVar65._0_8_ = auVar5._8_8_;
            auVar122._8_8_ = auVar8._8_8_;
            auVar122._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
            auVar123 = auVar65 * ZEXT816(0x1000003d10000) + auVar122 + auVar123;
            uVar134 = auVar123._0_8_;
            local_1e8.x.n[3] = uVar134 & 0xfffffffffffff;
            local_1e8.x.n[4] =
                 (auVar123._8_8_ << 0xc | uVar134 >> 0x34) + (auVar7._0_8_ & 0xffffffffffff);
            lVar142 = 0;
          }
          local_298[lVar142].x.n[4] = local_1e8.x.n[4];
          local_298[lVar142].x.n[2] = local_1e8.x.n[2];
          local_298[lVar142].x.n[3] = local_1e8.x.n[3];
          local_1e8.x.n[0]._0_4_ = (undefined4)uVar135;
          local_1e8.x.n[0]._4_4_ = (undefined4)(uVar135 >> 0x20);
          *(undefined4 *)local_298[lVar142].x.n = (undefined4)local_1e8.x.n[0];
          *(undefined4 *)((long)local_298[lVar142].x.n + 4) = local_1e8.x.n[0]._4_4_;
          *(undefined4 *)(local_298[lVar142].x.n + 1) = (undefined4)local_1e8.x.n[1];
          *(undefined4 *)((long)local_298[lVar142].x.n + 0xc) = local_1e8.x.n[1]._4_4_;
          psVar136 = &local_138;
          psVar137 = local_298;
          bVar129 = true;
          local_1e8.x.n[0] = uVar135;
          do {
            bVar132 = bVar129;
            if (psVar136->infinity == 0) {
              secp256k1_ge_set_gej_zinv(psVar137,psVar136,&psVar137->x);
            }
            psVar136 = &local_b8;
            psVar137 = local_298 + 1;
            bVar129 = false;
          } while (bVar132);
        }
        aggnonce->data[0] = 0xa8;
        aggnonce->data[1] = 0xb7;
        aggnonce->data[2] = 0xe4;
        aggnonce->data[3] = 'g';
        lVar138 = 4;
        psVar137 = local_298;
        bVar129 = true;
        do {
          bVar132 = bVar129;
          buf = aggnonce->data + lVar138;
          if (psVar137->infinity == 0) {
            secp256k1_ge_to_bytes(buf,psVar137);
          }
          else {
            buf[0x30] = '\0';
            buf[0x31] = '\0';
            buf[0x32] = '\0';
            buf[0x33] = '\0';
            buf[0x34] = '\0';
            buf[0x35] = '\0';
            buf[0x36] = '\0';
            buf[0x37] = '\0';
            buf[0x38] = '\0';
            buf[0x39] = '\0';
            buf[0x3a] = '\0';
            buf[0x3b] = '\0';
            buf[0x3c] = '\0';
            buf[0x3d] = '\0';
            buf[0x3e] = '\0';
            buf[0x3f] = '\0';
            buf[0x20] = '\0';
            buf[0x21] = '\0';
            buf[0x22] = '\0';
            buf[0x23] = '\0';
            buf[0x24] = '\0';
            buf[0x25] = '\0';
            buf[0x26] = '\0';
            buf[0x27] = '\0';
            buf[0x28] = '\0';
            buf[0x29] = '\0';
            buf[0x2a] = '\0';
            buf[0x2b] = '\0';
            buf[0x2c] = '\0';
            buf[0x2d] = '\0';
            buf[0x2e] = '\0';
            buf[0x2f] = '\0';
            buf[0x10] = '\0';
            buf[0x11] = '\0';
            buf[0x12] = '\0';
            buf[0x13] = '\0';
            buf[0x14] = '\0';
            buf[0x15] = '\0';
            buf[0x16] = '\0';
            buf[0x17] = '\0';
            buf[0x18] = '\0';
            buf[0x19] = '\0';
            buf[0x1a] = '\0';
            buf[0x1b] = '\0';
            buf[0x1c] = '\0';
            buf[0x1d] = '\0';
            buf[0x1e] = '\0';
            buf[0x1f] = '\0';
            buf[0] = '\0';
            buf[1] = '\0';
            buf[2] = '\0';
            buf[3] = '\0';
            buf[4] = '\0';
            buf[5] = '\0';
            buf[6] = '\0';
            buf[7] = '\0';
            buf[8] = '\0';
            buf[9] = '\0';
            buf[10] = '\0';
            buf[0xb] = '\0';
            buf[0xc] = '\0';
            buf[0xd] = '\0';
            buf[0xe] = '\0';
            buf[0xf] = '\0';
          }
          lVar138 = 0x44;
          psVar137 = local_298 + 1;
          bVar129 = false;
        } while (bVar132);
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int secp256k1_musig_nonce_agg(const secp256k1_context* ctx, secp256k1_musig_aggnonce  *aggnonce, const secp256k1_musig_pubnonce * const* pubnonces, size_t n_pubnonces) {
    secp256k1_gej aggnonce_ptsj[2];
    secp256k1_ge aggnonce_pts[2];
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(aggnonce != NULL);
    ARG_CHECK(pubnonces != NULL);
    ARG_CHECK(n_pubnonces > 0);

    if (!secp256k1_musig_sum_pubnonces(ctx, aggnonce_ptsj, pubnonces, n_pubnonces)) {
        return 0;
    }
    secp256k1_ge_set_all_gej_var(aggnonce_pts, aggnonce_ptsj, 2);
    secp256k1_musig_aggnonce_save(aggnonce, aggnonce_pts);
    return 1;
}